

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

void __thiscall inja::Parser::parse_into(Parser *this,Template *tmpl,string_view path)

{
  Kind KVar1;
  pointer pcVar2;
  string_view path_00;
  string_view path_01;
  bool bVar3;
  Token *this_00;
  Template *tmpl_00;
  allocator<char> local_d9;
  Template *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  Token *local_70;
  size_t local_68;
  char *local_60;
  string local_58;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  
  local_60 = path._M_str;
  local_68 = path._M_len;
  pcVar2 = (tmpl->content)._M_dataplus._M_p;
  (this->m_lexer).m_in._M_len = (tmpl->content)._M_string_length;
  (this->m_lexer).m_in._M_str = pcVar2;
  (this->m_lexer).m_state = Text;
  (this->m_lexer).m_tok_start = 0;
  (this->m_lexer).m_pos = 0;
  local_70 = &this->m_tok;
  local_38 = &(this->m_tok).text;
  this_00 = local_70;
  local_d8 = tmpl;
LAB_00109c60:
  get_next_token(this);
  KVar1 = (this->m_tok).kind;
  switch(KVar1) {
  case Text:
    local_d0._M_dataplus._M_p._0_1_ = 1;
    local_90._M_dataplus._M_p._0_4_ = 0;
    std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
    emplace_back<inja::Bytecode::Op,std::basic_string_view<char,std::char_traits<char>>&,unsigned_int>
              ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)local_d8,(Op *)&local_d0,
               local_38,(uint *)&local_90);
    goto LAB_00109c60;
  case ExpressionOpen:
    get_next_token(this);
    tmpl_00 = local_d8;
    bVar3 = parse_expression(this,local_d8);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"parser_error",&local_d9);
      Token::describe_abi_cxx11_(&local_58,local_70);
      std::operator+(&local_b0,"expected expression, got \'",&local_58);
      std::operator+(&local_d0,&local_b0,"\'");
      inja_throw(&local_90,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_90);
      tmpl_00 = local_d8;
    }
    append_function(this,tmpl_00,PrintValue,1);
    this_00 = local_70;
    if ((this->m_tok).kind != ExpressionClose) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"parser_error",&local_d9);
      Token::describe_abi_cxx11_(&local_58,this_00);
      std::operator+(&local_b0,"expected expression close, got \'",&local_58);
      std::operator+(&local_d0,&local_b0,"\'");
      inja_throw(&local_90,&local_d0);
      break;
    }
    goto LAB_00109c60;
  case ExpressionClose:
  case LineStatementClose:
  case StatementClose:
    goto switchD_00109c83_caseD_2;
  case LineStatementOpen:
    get_next_token(this);
    path_01._M_str = local_60;
    path_01._M_len = local_68;
    parse_statement(this,local_d8,path_01);
    KVar1 = (this->m_tok).kind;
    if ((KVar1 == LineStatementClose) || (KVar1 == Eof)) goto LAB_00109c60;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"parser_error",&local_d9)
    ;
    Token::describe_abi_cxx11_(&local_58,this_00);
    std::operator+(&local_b0,"expected line statement close, got \'",&local_58);
    std::operator+(&local_d0,&local_b0,"\'");
    inja_throw(&local_90,&local_d0);
    break;
  case StatementOpen:
    get_next_token(this);
    path_00._M_str = local_60;
    path_00._M_len = local_68;
    bVar3 = parse_statement(this,local_d8,path_00);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"parser_error",&local_d9);
      Token::describe_abi_cxx11_(&local_58,this_00);
      std::operator+(&local_b0,"expected statement, got \'",&local_58);
      std::operator+(&local_d0,&local_b0,"\'");
      inja_throw(&local_90,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if (this_00->kind == StatementClose) goto LAB_00109c60;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"parser_error",&local_d9)
    ;
    Token::describe_abi_cxx11_(&local_58,this_00);
    std::operator+(&local_b0,"expected statement close, got \'",&local_58);
    std::operator+(&local_d0,&local_b0,"\'");
    inja_throw(&local_90,&local_d0);
    break;
  case CommentOpen:
    goto switchD_00109c83_caseD_7;
  default:
    if (KVar1 == Eof) {
      if ((this->m_if_stack).
          super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->m_if_stack).
          super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"parser_error",(allocator<char> *)&local_b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"unmatched if",(allocator<char> *)&local_58);
        inja_throw(&local_90,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
      }
      if ((this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"parser_error",(allocator<char> *)&local_b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"unmatched for",(allocator<char> *)&local_58);
        inja_throw(&local_90,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
      }
      return;
    }
switchD_00109c83_caseD_2:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"parser_error",&local_d9)
    ;
    Token::describe_abi_cxx11_(&local_58,this_00);
    std::operator+(&local_b0,"unexpected token \'",&local_58);
    std::operator+(&local_d0,&local_b0,"\'");
    inja_throw(&local_90,&local_d0);
  }
  goto LAB_0010a03a;
switchD_00109c83_caseD_7:
  get_next_token(this);
  if ((this->m_tok).kind == CommentClose) goto LAB_00109c60;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"parser_error",&local_d9);
  Token::describe_abi_cxx11_(&local_58,this_00);
  std::operator+(&local_b0,"expected comment close, got \'",&local_58);
  std::operator+(&local_d0,&local_b0,"\'");
  inja_throw(&local_90,&local_d0);
LAB_0010a03a:
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_90);
  goto LAB_00109c60;
}

Assistant:

void parse_into(Template& tmpl, nonstd::string_view path) {
    m_lexer.start(tmpl.content);

    for (;;) {
      get_next_token();
      switch (m_tok.kind) {
        case Token::Kind::Eof:
          if (!m_if_stack.empty()) inja_throw("parser_error", "unmatched if");
          if (!m_loop_stack.empty()) inja_throw("parser_error", "unmatched for");
          return;
        case Token::Kind::Text:
          tmpl.bytecodes.emplace_back(Bytecode::Op::PrintText, m_tok.text, 0u);
          break;
        case Token::Kind::StatementOpen:
          get_next_token();
          if (!parse_statement(tmpl, path)) {
            inja_throw("parser_error", "expected statement, got '" + m_tok.describe() + "'");
          }
          if (m_tok.kind != Token::Kind::StatementClose) {
            inja_throw("parser_error", "expected statement close, got '" + m_tok.describe() + "'");
          }
          break;
        case Token::Kind::LineStatementOpen:
          get_next_token();
          parse_statement(tmpl, path);
          if (m_tok.kind != Token::Kind::LineStatementClose &&
              m_tok.kind != Token::Kind::Eof) {
            inja_throw("parser_error", "expected line statement close, got '" + m_tok.describe() + "'");
          }
          break;
        case Token::Kind::ExpressionOpen:
          get_next_token();
          if (!parse_expression(tmpl)) {
            inja_throw("parser_error", "expected expression, got '" + m_tok.describe() + "'");
          }
          append_function(tmpl, Bytecode::Op::PrintValue, 1);
          if (m_tok.kind != Token::Kind::ExpressionClose) {
            inja_throw("parser_error", "expected expression close, got '" + m_tok.describe() + "'");
          }
          break;
        case Token::Kind::CommentOpen:
          get_next_token();
          if (m_tok.kind != Token::Kind::CommentClose) {
            inja_throw("parser_error", "expected comment close, got '" + m_tok.describe() + "'");
          }
          break;
        default:
          inja_throw("parser_error", "unexpected token '" + m_tok.describe() + "'");
          break;
      }
    }
  }